

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageTexelBuffer::prepare
          (RenderVertexStorageTexelBuffer *this,PrepareRenderPassContext *context)

{
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  deUint32 viewPortWidth;
  deUint32 viewPortHeight;
  VkResult result;
  Context *pCVar1;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice_00;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkRenderPass VVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  ProgramBinary *pPVar4;
  VkDeviceSize VVar5;
  Handle<(vk::HandleType)14> *vertexShaderModule_00;
  Handle<(vk::HandleType)14> *fragmentShaderModule_00;
  unsigned_long uVar6;
  size_type sVar7;
  Handle<(vk::HandleType)19> *pHVar8;
  Handle<(vk::HandleType)21> *pHVar9;
  Handle<(vk::HandleType)22> HVar10;
  reference pvVar11;
  reference pvVar12;
  undefined4 local_690 [2];
  VkWriteDescriptorSet write;
  VkBufferViewCreateInfo createInfo_1;
  undefined1 local_5f0 [8];
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorSetLayout layout;
  size_t descriptorSetNdx;
  Handle<(vk::HandleType)22> local_5b0;
  Move<vk::Handle<(vk::HandleType)21>_> local_5a8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_588;
  undefined1 local_568 [8];
  VkDescriptorPoolCreateInfo createInfo;
  VkDescriptorPoolSize poolSizes;
  undefined1 auStack_528 [4];
  deUint32 descriptorCount;
  pointer pVStack_520;
  pointer local_518;
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  local_508;
  VkRenderPass local_4f0;
  undefined1 auStack_4e8 [8];
  VkDescriptorSetLayoutBinding binding;
  VkPhysicalDeviceProperties local_4c8;
  undefined1 local_190 [8];
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  string local_170;
  Move<vk::Handle<(vk::HandleType)14>_> local_150;
  RefData<vk::Handle<(vk::HandleType)14>_> local_130;
  undefined1 local_110 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragmentShaderModule;
  allocator<char> local_d9;
  string local_d8;
  Move<vk::Handle<(vk::HandleType)14>_> local_b8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_98;
  undefined1 local_78 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertexShaderModule;
  deUint32 subpass;
  VkRenderPass renderPass;
  VkDevice device;
  DeviceInterface *vkd;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vki;
  PrepareRenderPassContext *context_local;
  RenderVertexStorageTexelBuffer *this_local;
  
  pCVar1 = PrepareRenderPassContext::getContext(context);
  vk = Context::getInstanceInterface(pCVar1);
  pCVar1 = PrepareRenderPassContext::getContext(context);
  physicalDevice_00 = Context::getPhysicalDevice(pCVar1);
  pCVar1 = PrepareRenderPassContext::getContext(context);
  deviceInterface = Context::getDeviceInterface(pCVar1);
  pCVar1 = PrepareRenderPassContext::getContext(context);
  device_00 = Context::getDevice(pCVar1);
  VVar2 = PrepareRenderPassContext::getRenderPass(context);
  vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_
       = 0;
  pPVar3 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"storage-texel-buffer.vert",&local_d9);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_d8);
  ::vk::createShaderModule(&local_b8,deviceInterface,device_00,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data.deleter.m_deviceIface._0_4_ = (int)local_98.deleter.m_deviceIface;
  data.object.m_internal = local_98.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_98.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_98.deleter.m_device;
  data.deleter.m_allocator = local_98.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_78,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pPVar3 = PrepareRenderPassContext::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"render-white.frag",
             (allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_170);
  ::vk::createShaderModule(&local_150,deviceInterface,device_00,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_130,(Move *)&local_150);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_130.deleter.m_deviceIface;
  data_00.object.m_internal = local_130.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_130.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_130.deleter.m_device;
  data_00.deleter.m_allocator = local_130.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_110,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bindings.
                     super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          *)local_190);
  this->m_device = device_00;
  this->m_vkd = deviceInterface;
  VVar5 = PrepareRenderPassContext::getBufferSize(context);
  this->m_bufferSize = VVar5;
  ::vk::getPhysicalDeviceProperties(&local_4c8,vk,physicalDevice_00);
  this->m_maxStorageTexelCount = local_4c8.limits.maxTexelBufferElements;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  auStack_4e8._0_4_ = 0;
  auStack_4e8._4_4_ = VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER;
  binding.binding = 1;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  push_back((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             *)local_190,(value_type *)auStack_4e8);
  local_4f0 = VVar2;
  vertexShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_78);
  fragmentShaderModule_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_110);
  viewPortWidth = PrepareRenderPassContext::getTargetWidth(context);
  viewPortHeight = PrepareRenderPassContext::getTargetHeight(context);
  local_508.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508.
  super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::vector(&local_508);
  _auStack_528 = (pointer)0x0;
  pVStack_520 = (pointer)0x0;
  local_518 = (pointer)0x0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
            *)auStack_528);
  createPipelineWithResources
            (deviceInterface,device_00,local_4f0,0,vertexShaderModule_00,fragmentShaderModule_00,
             viewPortWidth,viewPortHeight,&local_508,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)auStack_528,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)local_190,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)0x0,
             &this->m_resources);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
             *)auStack_528);
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~vector(&local_508);
  poolSizes = (VkDescriptorPoolSize)((ulong)this->m_maxStorageTexelCount << 2);
  uVar6 = divRoundUp<unsigned_long>(&this->m_bufferSize,(unsigned_long *)&poolSizes);
  createInfo.pNext._4_4_ = (undefined4)uVar6;
  createInfo.pPoolSizes._0_4_ = 5;
  local_568._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 1;
  createInfo.flags = 1;
  createInfo._24_8_ = &createInfo.pPoolSizes;
  createInfo.pPoolSizes._4_4_ = createInfo.pNext._4_4_;
  ::vk::createDescriptorPool
            (&local_5a8,deviceInterface,device_00,(VkDescriptorPoolCreateInfo *)local_568,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_588,(Move *)&local_5a8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_588.deleter.m_deviceIface;
  data_01.object.m_internal = local_588.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_588.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_588.deleter.m_device;
  data_01.deleter.m_allocator = local_588.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_5a8);
  ::vk::Handle<(vk::HandleType)22>::Handle(&local_5b0,0);
  std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
  resize(&this->m_descriptorSets,uVar6 & 0xffffffff,&local_5b0);
  ::vk::Handle<(vk::HandleType)12>::Handle((Handle<(vk::HandleType)12> *)&descriptorSetNdx,0);
  std::vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
  resize(&this->m_bufferViews,uVar6 & 0xffffffff,(value_type *)&descriptorSetNdx);
  layout.m_internal = 0;
  while( true ) {
    sVar7 = std::
            vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
            ::size(&this->m_descriptorSets);
    if (sVar7 <= layout.m_internal) break;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_resources).descriptorSetLayout.
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    allocateInfo.pSetLayouts = (VkDescriptorSetLayout *)pHVar8->m_internal;
    local_5f0._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    allocateInfo._4_4_ = 0;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                       (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    allocateInfo.pNext = (void *)pHVar9->m_internal;
    allocateInfo.descriptorPool.m_internal._0_4_ = 1;
    allocateInfo._24_8_ = &allocateInfo.pSetLayouts;
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.range,deviceInterface,
               device_00,(VkDescriptorSetAllocateInfo *)local_5f0);
    HVar10 = ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::disown
                       ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.range);
    pvVar11 = std::
              vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
              ::operator[](&this->m_descriptorSets,layout.m_internal);
    pvVar11->m_internal = HVar10.m_internal;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&createInfo_1.range);
    write.pTexelBufferView._0_4_ = 0xd;
    createInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    createInfo_1._4_4_ = 0;
    createInfo_1.pNext._0_4_ = 0;
    createInfo_1._16_8_ = PrepareRenderPassContext::getBuffer(context);
    createInfo_1.buffer.m_internal._0_4_ = 0x62;
    createInfo_1._32_8_ = layout.m_internal * this->m_maxStorageTexelCount * 4;
    uVar6 = de::min<unsigned_long>
                      ((ulong)(this->m_maxStorageTexelCount << 2),
                       this->m_bufferSize + layout.m_internal * this->m_maxStorageTexelCount * -4);
    createInfo_1.offset = uVar6 & 0xffffffff;
    pvVar12 = std::
              vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
              ::operator[](&this->m_bufferViews,layout.m_internal);
    result = (*deviceInterface->_vptr_DeviceInterface[0x23])
                       (deviceInterface,device_00,&write.pTexelBufferView,0,pvVar12);
    ::vk::checkResult(result,
                      "vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                      ,0x1618);
    local_690[0] = 0x23;
    write.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    write._4_4_ = 0;
    pvVar11 = std::
              vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
              ::operator[](&this->m_descriptorSets,layout.m_internal);
    write.pNext = (void *)pvVar11->m_internal;
    write.dstSet.m_internal._0_4_ = 0;
    write.dstSet.m_internal._4_4_ = 0;
    write.dstBinding = 1;
    write.dstArrayElement = 5;
    write.descriptorCount = 0;
    write.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    write.pImageInfo = (VkDescriptorImageInfo *)0x0;
    write.pBufferInfo =
         (VkDescriptorBufferInfo *)
         std::
         vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
         operator[](&this->m_bufferViews,layout.m_internal);
    (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device_00,1,local_690,0,0);
    layout.m_internal = layout.m_internal + 1;
  }
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  ~vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           *)local_190);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_110);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_78);
  return;
}

Assistant:

void RenderVertexStorageTexelBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::InstanceInterface&				vki						= context.getContext().getInstanceInterface();
	const vk::VkPhysicalDevice					physicalDevice			= context.getContext().getPhysicalDevice();
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-texel-buffer.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	m_device				= device;
	m_vkd					= &vkd;
	m_bufferSize			= context.getBufferSize();
	m_maxStorageTexelCount	= vk::getPhysicalDeviceProperties(vki, physicalDevice).limits.maxTexelBufferElements;

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
			1,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	{
		const deUint32							descriptorCount	= (deUint32)(divRoundUp(m_bufferSize, (vk::VkDeviceSize)m_maxStorageTexelCount * 4));
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
			descriptorCount
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			descriptorCount,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
		m_descriptorSets.resize(descriptorCount, (vk::VkDescriptorSet)0);
		m_bufferViews.resize(descriptorCount, (vk::VkBufferView)0);
	}

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSets[descriptorSetNdx] = vk::allocateDescriptorSet(vkd, device, &allocateInfo).disown();

		{
			const vk::VkBufferViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getBuffer(),
				vk::VK_FORMAT_R32_UINT,
				descriptorSetNdx * m_maxStorageTexelCount * 4,
				(deUint32)de::min<vk::VkDeviceSize>(m_maxStorageTexelCount * 4, m_bufferSize - descriptorSetNdx * m_maxStorageTexelCount * 4)
			};

			VK_CHECK(vkd.createBufferView(device, &createInfo, DE_NULL, &m_bufferViews[descriptorSetNdx]));
		}

		{
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				m_descriptorSets[descriptorSetNdx],
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
				DE_NULL,
				DE_NULL,
				&m_bufferViews[descriptorSetNdx]
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}